

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

bool __thiscall ZAP::Archive::getRawData(Archive *this,Entry *entry,char **data,size_t *size)

{
  istream *piVar1;
  void *pvVar2;
  fpos<__mbstate_t> local_40;
  size_t *local_30;
  size_t *size_local;
  char **data_local;
  Entry *entry_local;
  Archive *this_local;
  
  if (entry == (Entry *)0x0) {
    this_local._7_1_ = false;
  }
  else if (entry->compressed_size == 0) {
    this_local._7_1_ = false;
  }
  else {
    piVar1 = this->stream;
    local_30 = size;
    size_local = (size_t *)data;
    data_local = (char **)entry;
    entry_local = (Entry *)this;
    std::fpos<__mbstate_t>::fpos(&local_40,(ulong)entry->index);
    std::istream::seekg(piVar1,local_40._M_off,local_40._M_state);
    *local_30 = (ulong)*(uint *)(data_local + 5);
    pvVar2 = operator_new__((ulong)*(uint *)(data_local + 5));
    *size_local = (size_t)pvVar2;
    std::istream::read((char *)this->stream,*size_local);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Archive::getRawData(const Entry *entry, char *&data, std::size_t &size) const
	{
		if (entry == nullptr)
			return false;

		if (entry->compressed_size == 0)
			return false;

		stream->seekg(entry->index);

		size = entry->compressed_size;
		data = new char[entry->compressed_size];
		stream->read(data, entry->compressed_size);
		return true;
	}